

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtendedKalmanFilter.cpp
# Opt level: O2

void __thiscall ExtendedKalmanFilter_init_Test::TestBody(ExtendedKalmanFilter_init_Test *this)

{
  bool bVar1;
  AssertionResult *this_00;
  AssertHelper *this_01;
  char *in_R9;
  undefined1 local_b8 [8];
  ExtendedKalmanFilter<Kalman::Vector<float,_3>_> ekf;
  ExtendedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> ekfMatrix;
  AssertionResult gtest_ar_;
  AssertHelper local_38;
  AssertionResult gtest_ar__1;
  AssertHelper local_20;
  
  Kalman::ExtendedKalmanFilter<Kalman::Vector<float,_3>_>::ExtendedKalmanFilter
            ((ExtendedKalmanFilter<Kalman::Vector<float,_3>_> *)local_b8);
  ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 1e-05;
  bVar1 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::isIdentity
                    ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                     ((long)&ekf.super_KalmanFilterBase<Kalman::Vector<float,_3>_>.x.
                             super_Matrix<float,_3,_1>.
                             super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data + 4),
                     (float *)((long)&ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                                      super_StandardBase<Kalman::Vector<float,_3>_>.P.
                                      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                      m_storage.m_data + 0x1c));
  this_00 = &gtest_ar_;
  ekfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
  super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       (float)CONCAT31(ekfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                       super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                       array[7]._1_3_,bVar1);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (bVar1) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
    Kalman::ExtendedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::ExtendedKalmanFilter
              ((ExtendedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
               ((long)&ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                       super_StandardBase<Kalman::Vector<float,_3>_>.P.
                       super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + 0x1c));
    ekfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
    super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 1e-05;
    local_38.data_._0_1_ =
         (internal)
         Eigen::MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::isIdentity
                   ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                    ((long)ekfMatrix.super_KalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.x.
                           super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array + 4),
                    (float *)((long)&ekfMatrix.
                                     super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                                     super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                     m_storage.m_data + 0x1c));
    this_00 = &gtest_ar__1;
    gtest_ar__1.success_ = false;
    gtest_ar__1._1_7_ = 0;
    if ((bool)local_38.data_._0_1_) goto LAB_0018368d;
    testing::Message::Message((Message *)&local_20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               ((long)&ekfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                       super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + 0x1c),(internal *)&local_38,(AssertionResult *)"ekfMatrix.P.isIdentity()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/ExtendedKalmanFilter.cpp"
               ,0x12,(char *)CONCAT44(ekfMatrix.
                                      super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                                      .super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                                      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                      m_storage.m_data.array[8],
                                      ekfMatrix.
                                      super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                                      .super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                                      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                      m_storage.m_data.array[7]));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__1.message_,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    std::__cxx11::string::~string
              ((string *)
               ((long)&ekfMatrix.super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                       super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                       super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + 0x1c));
    this_01 = &local_20;
  }
  else {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               ((long)&ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                       super_StandardBase<Kalman::Vector<float,_3>_>.P.
                       super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + 0x1c),(internal *)
                       ((long)&ekfMatrix.
                               super_StandardFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                               super_StandardBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.P.
                               super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage
                               .m_data + 0x1c),(AssertionResult *)"ekf.P.isIdentity()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/ExtendedKalmanFilter.cpp"
               ,0xe,(char *)CONCAT44(ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                                     super_StandardBase<Kalman::Vector<float,_3>_>.P.
                                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                     m_storage.m_data.array[8],
                                     ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                                     super_StandardBase<Kalman::Vector<float,_3>_>.P.
                                     super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                     m_storage.m_data.array[7]));
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    std::__cxx11::string::~string
              ((string *)
               ((long)&ekf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
                       super_StandardBase<Kalman::Vector<float,_3>_>.P.
                       super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
               + 0x1c));
    this_01 = &local_38;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_01);
LAB_0018368d:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this_00);
  return;
}

Assistant:

TEST(ExtendedKalmanFilter, init) {
    ExtendedKalmanFilter<Vector<T, 3>> ekf;
    ASSERT_TRUE(ekf.P.isIdentity()); // P should be identity

    // Same as above, but with general matrix type instead of vector
    ExtendedKalmanFilter<Matrix<T, 3, 1>> ekfMatrix;
    ASSERT_TRUE(ekfMatrix.P.isIdentity()); // P should be identity
}